

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_ALSA.c
# Opt level: O1

UINT8 WriteBuffer(DRV_ALSA *drv,UINT32 dataSize,void *data)

{
  UINT8 UVar1;
  int iVar2;
  int iVar3;
  snd_pcm_t *psVar4;
  
  do {
    iVar2 = snd_pcm_writei(drv->hPCM,data,(ulong)dataSize / (ulong)(drv->waveFmt).nBlockAlign);
  } while (iVar2 == -0xb);
  if (iVar2 == -0x56) {
    psVar4 = drv->hPCM;
    while (iVar3 = snd_pcm_resume(psVar4), iVar3 == -0xb) {
      usleep(1000);
      psVar4 = drv->hPCM;
    }
    iVar2 = -0x20;
    if (-1 < iVar3) {
      iVar2 = iVar3;
    }
  }
  if (iVar2 != -0x20) {
    return (UINT8)iVar2;
  }
  UVar1 = snd_pcm_prepare(drv->hPCM);
  return UVar1;
}

Assistant:

static UINT8 WriteBuffer(DRV_ALSA* drv, UINT32 dataSize, void* data)
{
	int retVal;
	
	do
	{
		retVal = snd_pcm_writei(drv->hPCM, data, dataSize / drv->waveFmt.nBlockAlign);
	} while (retVal == -EAGAIN);
	if (retVal == -ESTRPIPE)
	{
		retVal = snd_pcm_resume(drv->hPCM);
		while(retVal == -EAGAIN)
		{
			Sleep(1);
			retVal = snd_pcm_resume(drv->hPCM);
		}
		if (retVal < 0)
			retVal = -EPIPE;
	}
	if (retVal == -EPIPE)
	{
		// buffer underrun
		snd_pcm_prepare(drv->hPCM);
	}
	
	return AERR_OK;
}